

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::make_reference
          (value *__return_storage_ptr__,impl *this,value *obj,value *prop)

{
  global_object *pgVar1;
  string local_68;
  object_ptr local_58;
  reference local_48;
  value *local_28;
  value *prop_local;
  value *obj_local;
  impl *this_local;
  
  local_28 = prop;
  prop_local = obj;
  obj_local = (value *)this;
  this_local = (impl *)__return_storage_ptr__;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
  (*(pgVar1->super_object)._vptr_object[0x11])(&local_58,pgVar1,prop_local);
  to_string((mjs *)&local_68,this->heap_,local_28);
  reference::reference(&local_48,&local_58,&local_68);
  value::value(__return_storage_ptr__,&local_48);
  reference::~reference(&local_48);
  string::~string(&local_68);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value make_reference(const value& obj, const value& prop) {
        return value{reference{global_->to_object(obj), to_string(heap_, prop)}};
    }